

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

IndexTensor *
dynet::TensorTools::categorical_sample_log_prob_dev<dynet::Device_CPU>
          (Device_CPU *dev,Tensor *v,uint dim,uint num)

{
  runtime_error *this;
  invalid_argument *this_00;
  reference ppAVar1;
  DenseIndex *pDVar2;
  uint in_ECX;
  void *in_RDX;
  undefined1 *__ptr;
  IndexTensor *in_RDI;
  uint in_R8D;
  double __x;
  double __x_00;
  Tensor copy;
  Dim copy_dim;
  AlignedMemoryPool *scratch_allocator;
  Dim ids_dim;
  ostringstream oss_1;
  ostringstream oss;
  value_type dev_00;
  Dim *in_stack_fffffffffffff960;
  DeviceMempool mem;
  value_type this_01;
  TensorTupleReducerOp<Eigen::internal::ArgMaxTupleReducer<Eigen::Tuple<long,_float>_>,_const_std::array<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>_>
  *in_stack_fffffffffffff968;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<long,_4,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  *in_stack_fffffffffffff970;
  ostringstream *poVar3;
  Dim *in_stack_fffffffffffff978;
  Tensor *in_stack_fffffffffffff980;
  IndexTensor *this_02;
  real in_stack_fffffffffffff998;
  real in_stack_fffffffffffff99c;
  AlignedMemoryPool *in_stack_fffffffffffff9a0;
  Tensor *in_stack_fffffffffffff9c0;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_0>
  local_600 [120];
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
  local_588 [248];
  undefined1 local_490 [192];
  void *local_3d0;
  undefined1 local_3b4 [36];
  value_type local_390;
  uint local_388 [9];
  undefined1 local_361;
  string local_360 [32];
  ostringstream local_340 [383];
  undefined1 local_1c1;
  string local_1c0 [48];
  ostringstream local_190 [376];
  uint local_18;
  uint local_14;
  void *local_10;
  
  if (1 < in_R8D) {
    poVar3 = local_190;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,
                    "Currently do not support num > 1 in categorical_sample_log_prob");
    local_1c1 = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this,local_1c0);
    local_1c1 = 0;
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*(int *)((long)in_RDX + 0x38) == 4) {
    poVar3 = local_340;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::operator<<((ostream *)poVar3,
                    "Input Tensor to TensorTools::argmax must be associated with a memory pool.");
    local_361 = 1;
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this_00,local_360);
    local_361 = 0;
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this_02 = in_RDI;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_RDX;
  memcpy(local_388,in_RDX,0x24);
  local_388[local_14] = local_18;
  IndexTensor::IndexTensor
            ((IndexTensor *)in_stack_fffffffffffff980,in_stack_fffffffffffff978,
             (DenseIndex *)in_stack_fffffffffffff970,(Device *)in_stack_fffffffffffff968,
             (DeviceMempool)((ulong)in_stack_fffffffffffff960 >> 0x20));
  ppAVar1 = std::vector<dynet::AlignedMemoryPool_*,_std::allocator<dynet::AlignedMemoryPool_*>_>::
            operator[]((vector<dynet::AlignedMemoryPool_*,_std::allocator<dynet::AlignedMemoryPool_*>_>
                        *)(*(long *)((long)local_10 + 0x30) + 0x50),3);
  dev_00 = *ppAVar1;
  local_390 = dev_00;
  Dim::size(in_stack_fffffffffffff960);
  mem = (DeviceMempool)((ulong)in_stack_fffffffffffff960 >> 0x20);
  pDVar2 = (DenseIndex *)
           AlignedMemoryPool::allocate
                     (in_stack_fffffffffffff9a0,
                      CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
  this_02->v = pDVar2;
  memcpy(local_3b4,local_10,0x24);
  Tensor::Tensor(in_stack_fffffffffffff980,in_stack_fffffffffffff978,
                 (float *)in_stack_fffffffffffff970,(Device *)in_stack_fffffffffffff968,mem);
  this_01 = local_390;
  Dim::size((Dim *)local_390);
  local_3d0 = AlignedMemoryPool::allocate
                        (in_stack_fffffffffffff9a0,
                         CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998));
  randomize_uniform((Tensor *)in_stack_fffffffffffff9a0,in_stack_fffffffffffff99c,
                    in_stack_fffffffffffff998);
  Tensor::tb<4>(in_stack_fffffffffffff9c0);
  Tensor::tb<4>(in_stack_fffffffffffff9c0);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_0>::
  log(local_600,__x);
  Eigen::
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
  ::operator-((TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
               *)in_stack_fffffffffffff978);
  Eigen::
  TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>,_0>
  ::log(local_588,__x_00);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,5,0,long>,0,Eigen::MakePointer>,0>::
  operator-((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_0>
             *)this_02,
            (TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
             *)in_stack_fffffffffffff980);
  Eigen::
  TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_0>
  ::argmax((TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_log_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_5,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_0>
            *)this_02,(Index)in_stack_fffffffffffff980);
  IndexTensor::tb<3>((IndexTensor *)in_stack_fffffffffffff9a0);
  Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<long,_4,_0,_long>,_0,_Eigen::MakePointer>,_1>::
  device<Eigen::DefaultDevice>
            ((TensorBase<Eigen::TensorMap<Eigen::Tensor<long,_4,_0,_long>,_0,_Eigen::MakePointer>,_1>
              *)this_01,(DefaultDevice *)dev_00);
  __ptr = local_490;
  Eigen::
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<long,4,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
  ::operator=(in_stack_fffffffffffff970,in_stack_fffffffffffff968);
  AlignedMemoryPool::free(local_390,__ptr);
  return in_RDI;
}

Assistant:

IndexTensor TensorTools::categorical_sample_log_prob_dev(const MyDevice & dev, const Tensor& v, unsigned dim, unsigned num) {
  if(num > 1)
    DYNET_RUNTIME_ERR("Currently do not support num > 1 in categorical_sample_log_prob");
  DYNET_ARG_CHECK(v.mem_pool != DeviceMempool::NONE, "Input Tensor to TensorTools::argmax must be associated with a memory pool.");
  Dim ids_dim = v.d; ids_dim.d[dim] = num;
  IndexTensor ids(ids_dim, nullptr, v.device, v.mem_pool);
  AlignedMemoryPool* scratch_allocator = v.device->pools[(int)DeviceMempool::SCS];
  ids.v = static_cast<Eigen::DenseIndex*>(scratch_allocator->allocate(ids_dim.size() * sizeof(Eigen::DenseIndex)));
  Dim copy_dim = v.d; // TODO: make this match num to enable num
  Tensor copy(copy_dim, nullptr, v.device, v.mem_pool);
  copy.v = static_cast<float*>(scratch_allocator->allocate(v.d.size() * sizeof(float)));
  TensorTools::randomize_uniform(copy);
  ids.tb<3>().device(*dev.edevice) = (v.tb<4>() - (-copy.tb<4>().log()).log()).argmax(dim);
  scratch_allocator->free();
  return ids;
}